

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemStringify(Mem *pMem,u8 enc,u8 bForce)

{
  ushort uVar1;
  int iVar2;
  char in_DL;
  int *in_RDI;
  int nByte;
  int fg;
  Mem *in_stack_ffffffffffffffd8;
  int local_4;
  
  uVar1 = *(ushort *)(in_RDI + 2);
  iVar2 = sqlite3VdbeMemClearAndResize(in_stack_ffffffffffffffd8,0);
  if (iVar2 == 0) {
    if ((uVar1 & 4) == 0) {
      sqlite3_snprintf(*in_RDI,(char *)0x20,*(char **)(in_RDI + 4),"%!.15g");
    }
    else {
      sqlite3_snprintf(0x20,*(char **)(in_RDI + 4),"%lld",*(undefined8 *)in_RDI);
    }
    iVar2 = sqlite3Strlen30(*(char **)(in_RDI + 4));
    in_RDI[3] = iVar2;
    *(undefined1 *)((long)in_RDI + 10) = 1;
    *(ushort *)(in_RDI + 2) = *(ushort *)(in_RDI + 2) | 0x202;
    if (in_DL != '\0') {
      *(ushort *)(in_RDI + 2) = *(ushort *)(in_RDI + 2) & 0xfff3;
    }
    sqlite3VdbeChangeEncoding(in_stack_ffffffffffffffd8,0);
    local_4 = 0;
  }
  else {
    local_4 = 7;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemStringify(Mem *pMem, u8 enc, u8 bForce){
  int fg = pMem->flags;
  const int nByte = 32;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !(fg&MEM_Zero) );
  assert( !(fg&(MEM_Str|MEM_Blob)) );
  assert( fg&(MEM_Int|MEM_Real) );
  assert( (pMem->flags&MEM_RowSet)==0 );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );


  if( sqlite3VdbeMemClearAndResize(pMem, nByte) ){
    return SQLITE_NOMEM;
  }

  /* For a Real or Integer, use sqlite3_snprintf() to produce the UTF-8
  ** string representation of the value. Then, if the required encoding
  ** is UTF-16le or UTF-16be do a translation.
  ** 
  ** FIX ME: It would be better if sqlite3_snprintf() could do UTF-16.
  */
  if( fg & MEM_Int ){
    sqlite3_snprintf(nByte, pMem->z, "%lld", pMem->u.i);
  }else{
    assert( fg & MEM_Real );
    sqlite3_snprintf(nByte, pMem->z, "%!.15g", pMem->u.r);
  }
  pMem->n = sqlite3Strlen30(pMem->z);
  pMem->enc = SQLITE_UTF8;
  pMem->flags |= MEM_Str|MEM_Term;
  if( bForce ) pMem->flags &= ~(MEM_Int|MEM_Real);
  sqlite3VdbeChangeEncoding(pMem, enc);
  return SQLITE_OK;
}